

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_init(cpool *cpool,Curl_easy *idata,Curl_share *share,size_t size)

{
  size_t size_local;
  Curl_share *share_local;
  Curl_easy *idata_local;
  cpool *cpool_local;
  
  Curl_hash_init(&cpool->dest2bundle,size,Curl_hash_str,Curl_str_key_compare,cpool_bundle_free_entry
                );
  cpool->idata = idata;
  cpool->share = share;
  cpool->field_0x68 = cpool->field_0x68 & 0xfd | 2;
  return;
}

Assistant:

void Curl_cpool_init(struct cpool *cpool,
                     struct Curl_easy *idata,
                     struct Curl_share *share,
                     size_t size)
{
  Curl_hash_init(&cpool->dest2bundle, size, Curl_hash_str,
                 Curl_str_key_compare, cpool_bundle_free_entry);

  DEBUGASSERT(idata);

  cpool->idata = idata;
  cpool->share = share;
  cpool->initialised = TRUE;
}